

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countdown_latch_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::CountdownLatchTest_TestCountdownLatchFromZeroDefiniteAwait_Test::TestBody
          (CountdownLatchTest_TestCountdownLatchFromZeroDefiniteAwait_Test *this)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  char *message;
  char *in_R9;
  duration<long,_std::ratio<1L,_1000L>_> local_b0;
  AssertHelper local_a8;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  CountdownLatch latch;
  
  bidfx_public_api::tools::CountdownLatch::CountdownLatch(&latch,0);
  lVar2 = std::chrono::_V2::system_clock::now();
  bVar1 = (bool)bidfx_public_api::tools::CountdownLatch::Await(&latch,10000);
  gtest_ar_.success_ = bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1 == false) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"latch.Await(std::chrono::milliseconds(10000))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
               ,0x60,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  lVar3 = std::chrono::_V2::system_clock::now();
  gtest_ar_._0_8_ = lVar3 - lVar2;
  local_b0.__r = 10000;
  testing::internal::
  CmpHelperLT<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000l>>>
            ((internal *)&gtest_ar,"end.time_since_epoch() - start.time_since_epoch()",
             "std::chrono::milliseconds(10000)",
             (duration<long,_std::ratio<1L,_1000000000L>_> *)&gtest_ar_,&local_b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
               ,0x62,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::condition_variable::~condition_variable((condition_variable *)&latch);
  return;
}

Assistant:

TEST(CountdownLatchTest, TestCountdownLatchFromZeroDefiniteAwait)
{
    CountdownLatch latch = CountdownLatch(0);
    std::chrono::time_point<std::chrono::system_clock> start  = std::chrono::system_clock::now();
    EXPECT_TRUE(latch.Await(std::chrono::milliseconds(10000)));
    std::chrono::time_point<std::chrono::system_clock> end = std::chrono::system_clock::now();
    EXPECT_LT(end.time_since_epoch() - start.time_since_epoch(), std::chrono::milliseconds(10000));
}